

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  stbrp_rect *psVar1;
  byte bVar2;
  byte bVar3;
  stbtt_fontinfo *font;
  stbtt_pack_context *psVar4;
  unsigned_short uVar5;
  uint uVar6;
  unsigned_short uVar7;
  long lVar8;
  ulong uVar9;
  uchar *puVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  byte *pbVar16;
  stbtt_pack_range *psVar17;
  byte *pbVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  stbtt_pack_context *psVar22;
  float fVar23;
  int local_fc;
  int local_f8;
  int lsb;
  int x1;
  int y1;
  long local_e8;
  stbtt_packedchar *local_e0;
  stbtt_pack_range *local_d8;
  stbrp_rect *local_d0;
  ulong local_c8;
  ulong local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  stbtt_pack_range *local_a8;
  int local_a0;
  int local_9c;
  int advance;
  int x0;
  int y0;
  float local_8c;
  uint local_88;
  uint local_84;
  stbrp_rect *local_80;
  float local_78;
  float local_74;
  ulong local_70;
  stbtt_fontinfo *local_68;
  int local_5c;
  long local_58;
  stbtt_pack_context *local_50;
  float local_44;
  ulong local_40;
  byte local_38 [8];
  
  local_88 = spc->h_oversample;
  local_84 = spc->v_oversample;
  if (num_ranges < 1) {
    local_5c = 1;
  }
  else {
    local_c0 = (ulong)(uint)num_ranges;
    local_5c = 1;
    local_c8 = 0;
    _x1 = 0;
    local_d0 = rects;
    local_a8 = ranges;
    local_68 = info;
    local_50 = spc;
    do {
      local_b8 = local_a8[local_c8].font_size;
      if (local_b8 <= 0.0) {
        uStack_b4 = 0x80000000;
        uStack_b0 = 0x80000000;
        uStack_ac = 0x80000000;
        local_b8 = -local_b8;
        uVar12 = (uint)(ushort)(*(ushort *)(local_68->data + (long)local_68->head + 0x12) << 8 |
                               *(ushort *)(local_68->data + (long)local_68->head + 0x12) >> 8);
      }
      else {
        puVar10 = local_68->data;
        lVar8 = (long)local_68->hhea;
        uVar12 = ((int)(short)((ushort)puVar10[lVar8 + 4] << 8) | (uint)puVar10[lVar8 + 5]) -
                 ((int)(short)((ushort)puVar10[lVar8 + 6] << 8) | (uint)puVar10[lVar8 + 7]);
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
      }
      local_b8 = local_b8 / (float)(int)uVar12;
      psVar17 = local_a8 + local_c8;
      bVar2 = psVar17->h_oversample;
      spc->h_oversample = (uint)bVar2;
      bVar3 = psVar17->v_oversample;
      fVar23 = (float)bVar2;
      spc->v_oversample = (uint)bVar3;
      local_78 = 0.0;
      local_74 = 0.0;
      if (bVar2 != 0) {
        local_74 = (float)(int)(1 - (uint)bVar2) / (fVar23 + fVar23);
      }
      local_8c = (float)bVar3;
      if (bVar3 != 0) {
        local_78 = (float)(int)(1 - (uint)bVar3) / (local_8c + local_8c);
      }
      if (0 < psVar17->num_chars) {
        y0 = (int)(1.0 / fVar23);
        local_8c = 1.0 / local_8c;
        _x1 = (long)(int)_x1;
        local_e8 = 0;
        local_d8 = psVar17;
        do {
          if (rects[_x1].was_packed == 0) {
            local_5c = 0;
          }
          else {
            if (psVar17->array_of_unicode_codepoints == (int *)0x0) {
              iVar19 = psVar17->first_unicode_codepoint_in_range + (int)local_e8;
            }
            else {
              iVar19 = psVar17->array_of_unicode_codepoints[local_e8];
            }
            psVar1 = rects + _x1;
            local_e0 = psVar17->chardata_for_range + local_e8;
            x0 = stbtt_FindGlyphIndex(local_68,iVar19);
            font = local_68;
            iVar19 = spc->padding;
            lVar8 = (long)psVar1->x + (long)iVar19;
            psVar1->x = (stbrp_coord)lVar8;
            iVar21 = psVar1->y + iVar19;
            psVar1->y = iVar21;
            iVar20 = psVar1->w - iVar19;
            psVar1->w = iVar20;
            iVar19 = psVar1->h - iVar19;
            psVar1->h = iVar19;
            local_80 = psVar1;
            stbtt_GetGlyphHMetrics(local_68,x0,&local_a0,&local_fc);
            iVar15 = x0;
            local_70 = (ulong)local_50->h_oversample;
            local_40 = (ulong)local_50->v_oversample;
            local_58 = CONCAT44(local_58._4_4_,(float)local_70 * local_b8);
            local_44 = (float)local_40 * local_b8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (font,x0,(float)local_70 * local_b8,local_44,0.0,0.0,&local_9c,&advance,
                       &local_f8,&lsb);
            psVar4 = local_50;
            stbtt_MakeGlyphBitmapSubpixel
                      (local_68,local_50->pixels + iVar21 * local_50->stride_in_bytes + lVar8,
                       (iVar20 - (int)(float)local_70) + 1,(iVar19 - (int)local_40) + 1,
                       local_50->stride_in_bytes,(float)local_58,local_44,0.0,0.0,iVar15);
            uVar12 = psVar4->h_oversample;
            psVar22 = psVar4;
            if (1 < (ulong)uVar12) {
              local_58 = (long)psVar4->stride_in_bytes;
              iVar19 = local_80->w;
              local_38[0] = 0;
              local_38[1] = 0;
              local_38[2] = 0;
              local_38[3] = 0;
              local_38[4] = 0;
              local_38[5] = 0;
              local_38[6] = 0;
              local_38[7] = 0;
              local_70 = CONCAT44(local_70._4_4_,local_80->h);
              psVar22 = local_50;
              if (0 < local_80->h) {
                puVar10 = psVar4->pixels + local_80->y * local_58 + (long)local_80->x;
                local_40 = (ulong)(iVar19 - uVar12);
                uVar11 = (ulong)((iVar19 - uVar12) + 1);
                fVar23 = 0.0;
                do {
                  local_44 = fVar23;
                  memset(local_38,0,(ulong)uVar12);
                  switch(uVar12) {
                  case 2:
                    if ((int)local_40 < 0) {
LAB_001292b8:
                      uVar13 = 0;
                      uVar6 = 0;
                    }
                    else {
                      uVar13 = 0;
                      uVar6 = 0;
                      do {
                        bVar2 = puVar10[uVar13];
                        bVar3 = local_38[(uint)uVar13 & 7];
                        local_38[(uint)uVar13 + 2 & 7] = bVar2;
                        uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                        puVar10[uVar13] = (uchar)(uVar6 >> 1);
                        uVar13 = uVar13 + 1;
                      } while (uVar11 != uVar13);
                    }
                    break;
                  case 3:
                    if ((int)local_40 < 0) goto LAB_001292b8;
                    uVar13 = 0;
                    uVar6 = 0;
                    do {
                      bVar2 = puVar10[uVar13];
                      bVar3 = local_38[(uint)uVar13 & 7];
                      local_38[(uint)uVar13 + 3 & 7] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                      puVar10[uVar13] = (uchar)(uVar6 / 3);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                    break;
                  case 4:
                    if ((int)local_40 < 0) goto LAB_001292b8;
                    uVar13 = 0;
                    uVar6 = 0;
                    do {
                      bVar2 = puVar10[uVar13];
                      uVar9 = (ulong)((uint)uVar13 & 7);
                      local_38[uVar9 ^ 4] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)local_38[uVar9]);
                      puVar10[uVar13] = (uchar)(uVar6 >> 2);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                    break;
                  case 5:
                    if ((int)local_40 < 0) goto LAB_001292b8;
                    uVar13 = 0;
                    uVar6 = 0;
                    do {
                      bVar2 = puVar10[uVar13];
                      bVar3 = local_38[(uint)uVar13 & 7];
                      local_38[(uint)uVar13 + 5 & 7] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                      puVar10[uVar13] = (uchar)(uVar6 / 5);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                    break;
                  default:
                    if ((int)local_40 < 0) goto LAB_001292b8;
                    uVar13 = 0;
                    uVar6 = 0;
                    do {
                      bVar2 = puVar10[uVar13];
                      bVar3 = local_38[(uint)uVar13 & 7];
                      local_38[(uint)uVar13 + uVar12 & 7] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                      puVar10[uVar13] = (uchar)(uVar6 / uVar12);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                  }
                  if ((int)uVar13 < iVar19) {
                    uVar13 = uVar13 & 0xffffffff;
                    do {
                      if (puVar10[uVar13] != '\0') {
                        __assert_fail("pixels[i] == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0xadd,
                                      "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                     );
                      }
                      uVar6 = uVar6 - local_38[(uint)uVar13 & 7];
                      puVar10[uVar13] = (uchar)(uVar6 / uVar12);
                      uVar13 = uVar13 + 1;
                    } while ((int)uVar13 < iVar19);
                  }
                  puVar10 = puVar10 + local_58;
                  fVar23 = (float)((int)local_44 + 1);
                  psVar22 = local_50;
                } while (fVar23 != (float)local_70);
              }
            }
            uVar12 = psVar22->v_oversample;
            spc = psVar22;
            if (1 < (ulong)uVar12) {
              lVar8 = (long)psVar22->stride_in_bytes;
              local_58 = CONCAT44(local_58._4_4_,local_80->h);
              local_38[0] = 0;
              local_38[1] = 0;
              local_38[2] = 0;
              local_38[3] = 0;
              local_38[4] = 0;
              local_38[5] = 0;
              local_38[6] = 0;
              local_38[7] = 0;
              local_70 = CONCAT44(local_70._4_4_,local_80->w);
              spc = local_50;
              if (0 < local_80->w) {
                pbVar18 = psVar22->pixels + local_80->y * lVar8 + (long)local_80->x;
                uVar6 = local_80->h - uVar12;
                local_40 = (ulong)uVar6;
                uVar11 = (ulong)(uVar6 + 1);
                fVar23 = 0.0;
                do {
                  local_44 = fVar23;
                  memset(local_38,0,(ulong)uVar12);
                  switch(uVar12) {
                  case 2:
                    if ((int)local_40 < 0) {
LAB_001294ba:
                      uVar13 = 0;
                      uVar6 = 0;
                    }
                    else {
                      uVar13 = 0;
                      uVar6 = 0;
                      pbVar16 = pbVar18;
                      do {
                        bVar2 = *pbVar16;
                        bVar3 = local_38[(uint)uVar13 & 7];
                        local_38[(uint)uVar13 + 2 & 7] = bVar2;
                        uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                        *pbVar16 = (byte)(uVar6 >> 1);
                        uVar13 = uVar13 + 1;
                        pbVar16 = pbVar16 + lVar8;
                      } while (uVar11 != uVar13);
                    }
                    break;
                  case 3:
                    if ((int)local_40 < 0) goto LAB_001294ba;
                    uVar13 = 0;
                    uVar6 = 0;
                    pbVar16 = pbVar18;
                    do {
                      bVar2 = *pbVar16;
                      bVar3 = local_38[(uint)uVar13 & 7];
                      local_38[(uint)uVar13 + 3 & 7] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                      *pbVar16 = (byte)(uVar6 / 3);
                      uVar13 = uVar13 + 1;
                      pbVar16 = pbVar16 + lVar8;
                    } while (uVar11 != uVar13);
                    break;
                  case 4:
                    if ((int)local_40 < 0) goto LAB_001294ba;
                    uVar13 = 0;
                    uVar6 = 0;
                    pbVar16 = pbVar18;
                    do {
                      bVar2 = *pbVar16;
                      uVar9 = (ulong)((uint)uVar13 & 7);
                      local_38[uVar9 ^ 4] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)local_38[uVar9]);
                      *pbVar16 = (byte)(uVar6 >> 2);
                      uVar13 = uVar13 + 1;
                      pbVar16 = pbVar16 + lVar8;
                    } while (uVar11 != uVar13);
                    break;
                  case 5:
                    if ((int)local_40 < 0) goto LAB_001294ba;
                    uVar13 = 0;
                    uVar6 = 0;
                    pbVar16 = pbVar18;
                    do {
                      bVar2 = *pbVar16;
                      bVar3 = local_38[(uint)uVar13 & 7];
                      local_38[(uint)uVar13 + 5 & 7] = bVar2;
                      uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                      *pbVar16 = (byte)(uVar6 / 5);
                      uVar13 = uVar13 + 1;
                      pbVar16 = pbVar16 + lVar8;
                    } while (uVar11 != uVar13);
                    break;
                  default:
                    if ((int)local_40 < 0) {
                      uVar13 = 0;
                      uVar6 = 0;
                    }
                    else {
                      uVar13 = 0;
                      uVar6 = 0;
                      pbVar16 = pbVar18;
                      do {
                        bVar2 = *pbVar16;
                        bVar3 = local_38[(uint)uVar13 & 7];
                        local_38[(uint)uVar13 + uVar12 & 7] = bVar2;
                        uVar6 = uVar6 + ((uint)bVar2 - (uint)bVar3);
                        *pbVar16 = (byte)(uVar6 / uVar12);
                        uVar13 = uVar13 + 1;
                        pbVar16 = pbVar16 + lVar8;
                      } while (uVar11 != uVar13);
                    }
                  }
                  iVar19 = (int)uVar13;
                  iVar15 = (int)(float)local_58 - iVar19;
                  if (iVar15 != 0 && iVar19 <= (int)(float)local_58) {
                    lVar14 = (long)iVar19;
                    pbVar16 = pbVar18 + lVar8 * lVar14;
                    do {
                      if (*pbVar16 != 0) {
                        __assert_fail("pixels[i*stride_in_bytes] == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0xb1b,
                                      "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                     );
                      }
                      uVar6 = uVar6 - local_38[(uint)lVar14 & 7];
                      *pbVar16 = (byte)(uVar6 / uVar12);
                      lVar14 = lVar14 + 1;
                      pbVar16 = pbVar16 + lVar8;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  pbVar18 = pbVar18 + 1;
                  fVar23 = (float)((int)local_44 + 1);
                  spc = local_50;
                } while (fVar23 != (float)local_70);
              }
            }
            uVar5 = (unsigned_short)local_80->x;
            local_e0->x0 = uVar5;
            uVar7 = (unsigned_short)local_80->y;
            local_e0->y0 = uVar7;
            iVar19 = local_80->w;
            local_e0->x1 = uVar5 + (short)iVar19;
            iVar15 = local_80->h;
            local_e0->y1 = uVar7 + (short)iVar15;
            local_e0->xadvance = (float)local_a0 * local_b8;
            local_e0->xoff = (float)local_9c * (float)y0 + local_74;
            local_e0->yoff = (float)advance * local_8c + local_78;
            local_e0->xoff2 = (float)(local_9c + iVar19) * (float)y0 + local_74;
            local_e0->yoff2 = (float)(advance + iVar15) * local_8c + local_78;
            psVar17 = local_d8;
            rects = local_d0;
          }
          _x1 = _x1 + 1;
          local_e8 = local_e8 + 1;
        } while (local_e8 < psVar17->num_chars);
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_c0);
  }
  spc->h_oversample = local_88;
  spc->v_oversample = local_84;
  return local_5c;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}